

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O0

void __thiscall
asio::detail::
reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
::reactive_socket_accept_op_base
          (reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
           *this,error_code *success_ec,socket_type socket,state_type state,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer,tcp *protocol,
          endpoint *peer_endpoint,func_type complete_func)

{
  void *pvVar1;
  undefined1 in_CL;
  undefined4 in_EDX;
  reactor_op *in_RDI;
  undefined8 in_R8;
  int *in_R9;
  error_category *in_stack_00000008;
  func_type in_stack_ffffffffffffffa8;
  socket_holder *in_stack_ffffffffffffffb0;
  error_code *in_stack_ffffffffffffffb8;
  void **ppvVar2;
  
  reactor_op::reactor_op
            (in_RDI,in_stack_ffffffffffffffb8,(perform_func_type)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  *(undefined4 *)&in_RDI[1].super_operation.next_ = in_EDX;
  *(undefined1 *)((long)&in_RDI[1].super_operation.next_ + 4) = in_CL;
  socket_holder::socket_holder(in_stack_ffffffffffffffb0);
  *(undefined8 *)&in_RDI[1].super_operation.task_result_ = in_R8;
  in_RDI[1].ec_._M_value = *in_R9;
  in_RDI[1].ec_._M_cat = in_stack_00000008;
  ppvVar2 = &in_RDI[1].cancellation_key_;
  if (in_stack_00000008 == (error_category *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = (void *)ip::basic_endpoint<asio::ip::tcp>::capacity
                               ((basic_endpoint<asio::ip::tcp> *)0x20f986);
  }
  *ppvVar2 = pvVar1;
  return;
}

Assistant:

reactive_socket_accept_op_base(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state, Socket& peer,
      const Protocol& protocol, typename Protocol::endpoint* peer_endpoint,
      func_type complete_func)
    : reactor_op(success_ec,
        &reactive_socket_accept_op_base::do_perform, complete_func),
      socket_(socket),
      state_(state),
      peer_(peer),
      protocol_(protocol),
      peer_endpoint_(peer_endpoint),
      addrlen_(peer_endpoint ? peer_endpoint->capacity() : 0)
  {
  }